

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmu-hash64.c
# Opt level: O0

void ppc_hash64_filter_pagesizes
               (PowerPCCPU_conflict3 *cpu,_func__Bool_void_ptr_uint32_t_uint32_t *cb,void *opaque)

{
  PPCHash64Options *pPVar1;
  bool bVar2;
  _Bool _Var3;
  PPCHash64SegmentPageSizes *pPVar4;
  PPCHash64PageSize *pPVar5;
  PPCHash64PageSize *ps;
  int m;
  int j;
  PPCHash64SegmentPageSizes *sps;
  uint local_30;
  uint uStack_2c;
  _Bool ci_largepage;
  int n;
  int i;
  PPCHash64Options *opts;
  void *opaque_local;
  _func__Bool_void_ptr_uint32_t_uint32_t *cb_local;
  PowerPCCPU_conflict3 *cpu_local;
  
  pPVar1 = cpu->hash64_opts;
  bVar2 = false;
  if (pPVar1 == (PPCHash64Options *)0x0) {
    __assert_fail("opts",
                  "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/ppc/mmu-hash64.c"
                  ,0x4db,
                  "void ppc_hash64_filter_pagesizes(PowerPCCPU *, _Bool (*)(void *, uint32_t, uint32_t), void *)"
                 );
  }
  local_30 = 0;
  for (uStack_2c = 0; uStack_2c < 8; uStack_2c = uStack_2c + 1) {
    pPVar4 = pPVar1->sps + (int)uStack_2c;
    ps._0_4_ = 0;
    if ((int)uStack_2c < (int)local_30) {
      __assert_fail("n <= i",
                    "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/ppc/mmu-hash64.c"
                    ,0x4e3,
                    "void ppc_hash64_filter_pagesizes(PowerPCCPU *, _Bool (*)(void *, uint32_t, uint32_t), void *)"
                   );
    }
    if (pPVar4->page_shift == 0) break;
    for (ps._4_4_ = 0; ps._4_4_ < 8; ps._4_4_ = ps._4_4_ + 1) {
      pPVar5 = pPVar4->enc + (int)ps._4_4_;
      if ((int)ps._4_4_ < (int)(uint)ps) {
        __assert_fail("m <= j",
                      "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/ppc/mmu-hash64.c"
                      ,0x4ec,
                      "void ppc_hash64_filter_pagesizes(PowerPCCPU *, _Bool (*)(void *, uint32_t, uint32_t), void *)"
                     );
      }
      if (pPVar5->page_shift == 0) break;
      _Var3 = (*cb)(opaque,pPVar4->page_shift,pPVar5->page_shift);
      if (_Var3) {
        if (0xf < pPVar5->page_shift) {
          bVar2 = true;
        }
        pPVar4->enc[(int)(uint)ps] = *pPVar5;
        ps._0_4_ = (uint)ps + 1;
      }
    }
    for (ps._4_4_ = (uint)ps; ps._4_4_ < 8; ps._4_4_ = ps._4_4_ + 1) {
      memset(pPVar4->enc + (int)ps._4_4_,0,8);
    }
    if ((uint)ps != 0) {
      local_30 = local_30 + 1;
    }
  }
  for (uStack_2c = local_30; uStack_2c < 8; uStack_2c = uStack_2c + 1) {
    memset(pPVar1->sps + (int)uStack_2c,0,0x48);
  }
  if (!bVar2) {
    pPVar1->flags = pPVar1->flags & 0xfffffffb;
  }
  return;
}

Assistant:

void ppc_hash64_filter_pagesizes(PowerPCCPU *cpu,
                                 bool (*cb)(void *, uint32_t, uint32_t),
                                 void *opaque)
{
    PPCHash64Options *opts = cpu->hash64_opts;
    int i;
    int n = 0;
    bool ci_largepage = false;

    assert(opts);

    n = 0;
    for (i = 0; i < ARRAY_SIZE(opts->sps); i++) {
        PPCHash64SegmentPageSizes *sps = &opts->sps[i];
        int j;
        int m = 0;

        assert(n <= i);

        if (!sps->page_shift) {
            break;
        }

        for (j = 0; j < ARRAY_SIZE(sps->enc); j++) {
            PPCHash64PageSize *ps = &sps->enc[j];

            assert(m <= j);
            if (!ps->page_shift) {
                break;
            }

            if (cb(opaque, sps->page_shift, ps->page_shift)) {
                if (ps->page_shift >= 16) {
                    ci_largepage = true;
                }
                sps->enc[m++] = *ps;
            }
        }

        /* Clear rest of the row */
        for (j = m; j < ARRAY_SIZE(sps->enc); j++) {
            memset(&sps->enc[j], 0, sizeof(sps->enc[j]));
        }

        if (m) {
            n++;
        }
    }

    /* Clear the rest of the table */
    for (i = n; i < ARRAY_SIZE(opts->sps); i++) {
        memset(&opts->sps[i], 0, sizeof(opts->sps[i]));
    }

    if (!ci_largepage) {
        opts->flags &= ~PPC_HASH64_CI_LARGEPAGE;
    }
}